

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

string * __thiscall
tinyusdz::(anonymous_namespace)::DumpPrimTreeRec_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Prim *prim,uint32_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _anonymous_namespace_ *p_Var2;
  ostream *poVar3;
  string *psVar4;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_00;
  uint uVar5;
  Prim *child;
  _anonymous_namespace_ *this_00;
  stringstream ss;
  string local_230;
  _anonymous_namespace_ *local_210;
  string *local_208;
  string local_200;
  long local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_208 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((uint)prim < 0x8000001) {
    pprint::Indent_abi_cxx11_(&local_230,(pprint *)((ulong)prim & 0xffffffff),n);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)(this + 0x1a0),*(long *)(this + 0x1a8));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ",2);
    poVar3 = ::std::operator<<(poVar3,(Path *)this);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    paVar1 = &local_230.field_2;
    n_00 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_00;
    }
    uVar5 = (uint)prim + 1;
    pprint::Indent_abi_cxx11_(&local_230,(pprint *)(ulong)uVar5,n_00);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"prim_id {}","");
    local_1e0 = *(long *)(this + 0x318);
    local_210 = this;
    fmt::format<long>(&local_1d8,&local_200,&local_1e0);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = local_210;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    this_00 = *(_anonymous_namespace_ **)(p_Var2 + 0x2b0);
    p_Var2 = *(_anonymous_namespace_ **)(p_Var2 + 0x2b8);
    if (this_00 != p_Var2) {
      do {
        DumpPrimTreeRec_abi_cxx11_(&local_230,this_00,(Prim *)(ulong)uVar5,depth);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        this_00 = this_00 + 0x350;
      } while (this_00 != p_Var2);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar4 = (string *)::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string DumpPrimTreeRec(const Prim &prim, uint32_t depth) {
  std::stringstream ss;

  if (depth > 1024 * 1024 * 128) {
    // too deep node.
    return ss.str();
  }

  ss << pprint::Indent(depth) << "\"" << prim.element_name() << "\" "
     << prim.absolute_path() << "\n";
  ss << pprint::Indent(depth + 1) << fmt::format("prim_id {}", prim.prim_id())
     << "\n";

  for (const Prim &child : prim.children()) {
    ss << DumpPrimTreeRec(child, depth + 1);
  }

  return ss.str();
}